

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void units::removeUserDefinedUnit(string *name)

{
  pointer pcVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  long *plVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  precise_unit pVar7;
  unit unit;
  long lStack_78;
  undefined8 local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  double local_48;
  string local_40;
  
  plVar4 = &lStack_78;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + name->_M_string_length);
  if (local_68 == &local_58) {
    local_40.field_2._8_8_ = local_58._8_8_;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)local_68;
  }
  local_40.field_2._M_allocated_capacity._1_7_ = local_58._M_allocated_capacity._1_7_;
  local_40.field_2._M_local_buf[0] = local_58._M_local_buf[0];
  local_40._M_string_length = local_60;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_68 = &local_58;
  pVar7 = unit_from_string(&local_40,defaultMatchFlags);
  uVar5 = pVar7.multiplier_._0_4_;
  uVar6 = pVar7.multiplier_._4_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    local_48 = pVar7.multiplier_;
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    uVar5 = SUB84(local_48,0);
    uVar6 = (undefined4)((ulong)local_48 >> 0x20);
  }
  local_70 = (ulong)(uint)(float)(double)CONCAT44(uVar6,uVar5) | pVar7._8_8_ << 0x20;
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0])
                             + 1);
  }
  if ((NAN((float)local_70)) && (local_70._4_4_ == -0x56b5b78)) {
    if (user_defined_unit_names_abi_cxx11_._16_8_ != 0) {
      pcVar1 = (name->_M_dataplus)._M_p;
      sVar2 = name->_M_string_length;
      plVar4 = (long *)user_defined_unit_names_abi_cxx11_._16_8_;
      do {
        __n = plVar4[3];
        if ((__n == sVar2) &&
           ((__n == 0 || (iVar3 = bcmp((void *)plVar4[2],pcVar1,__n), iVar3 == 0))))
        goto LAB_003a2b6d;
        plVar4 = (long *)*plVar4;
      } while (plVar4 != (long *)0x0);
    }
  }
  else {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)user_defined_units_abi_cxx11_,name);
LAB_003a2b6d:
    std::
    _Hashtable<units::unit,_std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<units::unit>,_std::hash<units::unit>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase((_Hashtable<units::unit,_std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<units::unit>,_std::hash<units::unit>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)user_defined_unit_names_abi_cxx11_,plVar4 + 1);
  }
  return;
}

Assistant:

void removeUserDefinedUnit(const std::string& name)
{
    // get the currently converted unit
    auto unit = unit_cast_from_string(name);
    if (is_valid(unit)) {
        user_defined_units.erase(name);
        user_defined_unit_names.erase(unit);
    } else {
        for (const auto& udun : user_defined_unit_names) {
            if (udun.second == name) {
                user_defined_unit_names.erase(udun.first);
                break;
            }
        }
    }
}